

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextTest.cpp
# Opt level: O0

void __thiscall
ContextTest_shouldSetControlRequestChannel_Test::TestBody
          (ContextTest_shouldSetControlRequestChannel_Test *this)

{
  Configuration *this_00;
  undefined1 uVar1;
  bool bVar2;
  string *str;
  AssertHelper *in_stack_fffffffffffffb50;
  allocator *this_01;
  char *in_stack_fffffffffffffb60;
  allocator *message;
  int in_stack_fffffffffffffb6c;
  int line;
  char *in_stack_fffffffffffffb70;
  allocator *file;
  undefined8 in_stack_fffffffffffffb78;
  Type TVar3;
  undefined7 in_stack_fffffffffffffb80;
  string local_468 [24];
  char *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbc0;
  AssertionResult *in_stack_fffffffffffffbc8;
  AssertHelper *in_stack_fffffffffffffbd0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__3;
  Message local_3b0;
  allocator local_3a1;
  string local_3a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__2;
  Message local_320;
  allocator local_311;
  string local_310;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__1;
  ChannelUri uri;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1d0 [8];
  Context ctx;
  Configuration cfg;
  ContextTest_shouldSetControlRequestChannel_Test *this_local;
  
  TVar3 = (Type)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  this_00 = (Configuration *)((long)&ctx.controlRequestChannel_.field_2 + 8);
  aeron::archive::Configuration::Configuration(this_00);
  aeron::archive::Context::Context((Context *)local_1d0,this_00);
  aeron::archive::Context::controlRequestChannel_abi_cxx11_((Context *)local_1d0);
  local_1f1 = (bool)std::__cxx11::string::empty();
  local_1f1 = (bool)(local_1f1 ^ 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffb80));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0.ptr_,
               in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffb80),TVar3,
               in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb60);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb50);
    std::__cxx11::string::~string
              ((string *)
               &uri.tags_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  str = aeron::archive::Context::controlRequestChannel_abi_cxx11_((Context *)local_1d0);
  aeron::archive::ChannelUri::parse((ChannelUri *)&gtest_ar__1.message_,str);
  TVar3 = (Type)((ulong)str >> 0x20);
  file = &local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"term-length",file);
  aeron::archive::ChannelUri::get(&local_2f0,(ChannelUri *)&gtest_ar__1.message_,&local_310);
  testing::AssertionResult::AssertionResult<boost::optional<std::__cxx11::string>>
            ((AssertionResult *)local_2c8,&local_2f0,(type *)0x0);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional(&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb6c);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffb80));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0.ptr_,
               in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffb80),TVar3,(char *)file,line,
               in_stack_fffffffffffffb60);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb50);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  message = &local_3a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"mtu",message);
  aeron::archive::ChannelUri::get(&local_380,(ChannelUri *)&gtest_ar__1.message_,&local_3a0);
  testing::AssertionResult::AssertionResult<boost::optional<std::__cxx11::string>>
            ((AssertionResult *)local_358,&local_380,(type *)0x0);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional(&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffb80));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0.ptr_,
               in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffb80),TVar3,(char *)file,line,
               (char *)message);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb50);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  this_01 = (allocator *)&stack0xfffffffffffffbcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffbd0,"sparse",this_01);
  aeron::archive::ChannelUri::get
            (&local_410,(ChannelUri *)&gtest_ar__1.message_,(string *)&stack0xfffffffffffffbd0);
  testing::AssertionResult::AssertionResult<boost::optional<std::__cxx11::string>>
            ((AssertionResult *)local_3e8,&local_410,(type *)0x0);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional(&local_410);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbcf);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffb80));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0.ptr_,
               in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffb80),TVar3,(char *)file,line,
               (char *)message);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_468);
    testing::Message::~Message((Message *)&stack0xfffffffffffffbc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  aeron::archive::ChannelUri::~ChannelUri((ChannelUri *)&gtest_ar__1.message_);
  aeron::archive::Context::~Context((Context *)local_1d0);
  aeron::archive::Configuration::~Configuration
            ((Configuration *)((long)&ctx.controlRequestChannel_.field_2 + 8));
  return;
}

Assistant:

TEST(ContextTest, shouldSetControlRequestChannel) {
    Configuration cfg;
    Context ctx(cfg);

    EXPECT_FALSE(ctx.controlRequestChannel().empty());

    ChannelUri uri = ChannelUri::parse(ctx.controlRequestChannel());
    EXPECT_TRUE(uri.get("term-length"));
    EXPECT_TRUE(uri.get("mtu"));
    EXPECT_TRUE(uri.get("sparse"));
}